

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::operator()
          (result_type_conflict3 *__return_storage_ptr__,beta_dist<long_double> *this,lcg64_shift *r
          )

{
  result_type_conflict3 *prVar1;
  longdouble in_ST0;
  
  utility::u01xx_traits<long_double,_1UL,_trng::lcg64_shift>::oo
            ((longdouble *)this,(lcg64_shift *)this);
  prVar1 = (result_type_conflict3 *)
           math::detail::inv_Beta_I<long_double>
                     ((longdouble *)this,in_ST0,*(longdouble *)__return_storage_ptr__,
                      *(longdouble *)(__return_storage_ptr__ + 1),
                      *(longdouble *)(__return_storage_ptr__ + 2));
  return prVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return math::inv_Beta_I(utility::uniformoo<result_type>(r), P.alpha(), P.beta(),
                              P.norm());
    }